

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

string * __thiscall
testing::internal::FormatTimeInMillisAsSeconds_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,TimeInMillis ms)

{
  stringstream local_1a0 [8];
  stringstream ss;
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::ostream::_M_insert<double>((double)(long)this * 0.001);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatTimeInMillisAsSeconds(TimeInMillis ms) {
  ::std::stringstream ss;
  ss << (static_cast<double>(ms) * 1e-3);
  return ss.str();
}